

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

bool __thiscall
fmt::v11::basic_format_arg<fmt::v11::context>::format_custom
          (basic_format_arg<fmt::v11::context> *this,char_type *parse_begin,
          parse_context<char> *parse_ctx,context *ctx)

{
  int iVar1;
  iterator in_RCX;
  parse_context<char> *in_RDX;
  undefined8 *in_RDI;
  
  iVar1 = *(int *)(in_RDI + 2);
  if (iVar1 == 0xf) {
    parse_context<char>::advance_to(in_RDX,in_RCX);
    (*(code *)in_RDI[1])(*in_RDI,in_RDX,in_RCX);
  }
  return iVar1 == 0xf;
}

Assistant:

auto format_custom(const char_type* parse_begin,
                     parse_context<char_type>& parse_ctx, Context& ctx)
      -> bool {
    if (type_ != detail::type::custom_type) return false;
    parse_ctx.advance_to(parse_begin);
    value_.custom.format(value_.custom.value, parse_ctx, ctx);
    return true;
  }